

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

format_arg * __thiscall
duckdb_fmt::v6::internal::
get_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
          (format_arg *__return_storage_ptr__,internal *this,
          basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
          *ctx,int id)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  uint __val;
  uint uVar7;
  string __str;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  uVar7 = (uint)ctx;
  basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  ::get(__return_storage_ptr__,
        (basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
         *)(this + 8),uVar7);
  if (__return_storage_ptr__->type_ == none_type) {
    __val = -uVar7;
    if (0 < (int)uVar7) {
      __val = uVar7;
    }
    uVar7 = 1;
    if (9 < __val) {
      uVar6 = (ulong)__val;
      uVar1 = 4;
      do {
        uVar7 = uVar1;
        uVar3 = (uint)uVar6;
        if (uVar3 < 100) {
          uVar7 = uVar7 - 2;
          goto LAB_00763112;
        }
        if (uVar3 < 1000) {
          uVar7 = uVar7 - 1;
          goto LAB_00763112;
        }
        if (uVar3 < 10000) goto LAB_00763112;
        uVar6 = uVar6 / 10000;
        uVar1 = uVar7 + 4;
      } while (99999 < uVar3);
      uVar7 = uVar7 + 1;
    }
LAB_00763112:
    uVar6 = (ulong)ctx >> 0x1f & 1;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct((ulong)local_90,(char)uVar7 + (char)uVar6);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_90[0] + uVar6,uVar7,__val);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x780d4a);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_60 = *plVar4;
      lStack_58 = plVar2[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar4;
      local_70 = (long *)*plVar2;
    }
    local_68 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar5 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_50.field_2._M_allocated_capacity = *psVar5;
      local_50.field_2._8_8_ = plVar2[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar5;
      local_50._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_50._M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>::
    on_error((basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
              *)this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_CONSTEXPR typename Context::format_arg get_arg(Context& ctx, int id) {
  auto arg = ctx.arg(id);
  if (!arg) ctx.on_error("Argument index \"" + std::to_string(id) + "\" out of range");
  return arg;
}